

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ConsumeString(Parser *this,string *output,char *error)

{
  char *pcVar1;
  bool bVar2;
  Token *pTVar3;
  allocator local_49;
  string local_48;
  char *local_28;
  char *error_local;
  string *output_local;
  Parser *this_local;
  
  local_28 = error;
  error_local = (char *)output;
  output_local = (string *)this;
  bVar2 = LookingAtType(this,TYPE_STRING);
  pcVar1 = local_28;
  if (bVar2) {
    pTVar3 = io::Tokenizer::current(this->input_);
    io::Tokenizer::ParseString(&pTVar3->text,(string *)error_local);
    io::Tokenizer::Next(this->input_);
    while( true ) {
      bVar2 = LookingAtType(this,TYPE_STRING);
      if (!bVar2) break;
      pTVar3 = io::Tokenizer::current(this->input_);
      io::Tokenizer::ParseStringAppend(&pTVar3->text,(string *)error_local);
      io::Tokenizer::Next(this->input_);
    }
    this_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
    AddError(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ConsumeString(std::string* output, const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
    io::Tokenizer::ParseString(input_->current().text, output);
    input_->Next();
    // Allow C++ like concatenation of adjacent string tokens.
    while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      io::Tokenizer::ParseStringAppend(input_->current().text, output);
      input_->Next();
    }
    return true;
  } else {
    AddError(error);
    return false;
  }
}